

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O2

void __thiscall Tree::BuildUnit(Tree *this,cmXMLWriter *xml,string *fsPath)

{
  pointer pTVar1;
  _Rb_tree_node_base *p_Var2;
  Tree *folder;
  pointer this_00;
  allocator<char> local_61;
  Tree *local_60;
  _Rb_tree_node_base *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_58 = &(this->files)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_60 = this;
  for (p_Var2 = (this->files)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var2 != local_58; p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Unit",&local_61);
    cmXMLWriter::StartElement(xml,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::operator+(&local_50,fsPath,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var2 + 1)
                  );
    cmXMLWriter::Attribute<std::__cxx11::string>(xml,"filename",&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Option",&local_61);
    cmXMLWriter::StartElement(xml,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    cmXMLWriter::Attribute<char[13]>(xml,"virtualFolder",(char (*) [13])"CMake Files\\");
    cmXMLWriter::EndElement(xml);
    cmXMLWriter::EndElement(xml);
  }
  pTVar1 = (local_60->folders).super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (local_60->folders).super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pTVar1; this_00 = this_00 + 1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_61);
    BuildUnitImpl(this_00,xml,&local_50,fsPath);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void Tree::BuildUnit(cmXMLWriter& xml, const std::string& fsPath) const
{
  for (std::string const& f : files) {
    xml.StartElement("Unit");
    xml.Attribute("filename", fsPath + f);

    xml.StartElement("Option");
    xml.Attribute("virtualFolder", "CMake Files\\");
    xml.EndElement();

    xml.EndElement();
  }
  for (Tree const& folder : folders) {
    folder.BuildUnitImpl(xml, "", fsPath);
  }
}